

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmNtk.c
# Opt level: O1

void Sfm_NtkDeleteObj_rec(Sfm_Ntk_t *p,int iNode)

{
  int iNode_00;
  uint uVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  int *piVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  bool bVar13;
  
  if ((iNode < 0) || ((p->vFanouts).nSize <= iNode)) {
LAB_004db2e0:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWec.h"
                  ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
  }
  if (((p->vFanouts).pArray[(uint)iNode].nSize < 1) && (p->nPis <= iNode)) {
    if (p->vFixed->nSize <= iNode) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecStr.h"
                    ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
    }
    if (p->vFixed->pArray[(uint)iNode] == '\0') {
      if ((iNode < p->nPis) || (p->nObjs <= p->nPos + iNode)) {
        __assert_fail("Sfm_ObjIsNode(p, iNode)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/sfm/sfmNtk.c"
                      ,0x11d,"void Sfm_NtkDeleteObj_rec(Sfm_Ntk_t *, int)");
      }
      if (iNode < (p->vFanins).nSize) {
        lVar12 = 0;
        do {
          pVVar2 = (p->vFanins).pArray;
          if (pVVar2[(uint)iNode].nSize <= lVar12) {
            pVVar2[(uint)iNode].nSize = 0;
            if (iNode < p->vTruths->nSize) {
              p->vTruths->pArray[(uint)iNode] = 0;
              return;
            }
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                          ,0x1ae,"void Vec_WrdWriteEntry(Vec_Wrd_t *, int, word)");
          }
          if (pVVar2[(uint)iNode].nSize <= lVar12) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iNode_00 = pVVar2[(uint)iNode].pArray[lVar12];
          lVar7 = (long)iNode_00;
          if ((lVar7 < 0) || ((p->vFanouts).nSize <= iNode_00)) break;
          pVVar2 = (p->vFanouts).pArray;
          uVar1 = pVVar2[lVar7].nSize;
          uVar6 = 0;
          bVar13 = 0 < (int)uVar1;
          if (0 < (int)uVar1) {
            bVar13 = true;
            if (*pVVar2[lVar7].pArray != iNode) {
              uVar10 = 0;
              do {
                if ((ulong)uVar1 - 1 == uVar10) {
                  bVar13 = false;
                  uVar6 = (ulong)uVar1;
                  goto LAB_004db273;
                }
                uVar6 = uVar10 + 1;
                lVar4 = uVar10 + 1;
                uVar10 = uVar6;
              } while (pVVar2[lVar7].pArray[lVar4] != iNode);
              bVar13 = uVar6 < uVar1;
            }
          }
LAB_004db273:
          uVar5 = (uint)uVar6;
          if (uVar5 == uVar1) {
LAB_004db32b:
            __assert_fail("RetValue",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/sfm/sfmNtk.c"
                          ,0x120,"void Sfm_NtkDeleteObj_rec(Sfm_Ntk_t *, int)");
          }
          if (!bVar13) {
            __assert_fail("i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x3dc,"int Vec_IntRemove(Vec_Int_t *, int)");
          }
          uVar9 = uVar1;
          if ((int)(uVar5 + 1) < (int)uVar1) {
            piVar3 = pVVar2[lVar7].pArray;
            piVar8 = piVar3 + (uVar5 + 1);
            uVar6 = uVar6 & 0xffffffff;
            do {
              iVar11 = (int)uVar6;
              piVar3[uVar6] = *piVar8;
              uVar9 = pVVar2[lVar7].nSize;
              piVar8 = piVar8 + 1;
              uVar6 = (ulong)(iVar11 + 1);
            } while (iVar11 + 2 < (int)uVar9);
          }
          pVVar2[lVar7].nSize = uVar9 - 1;
          if (uVar5 == uVar1) goto LAB_004db32b;
          Sfm_NtkDeleteObj_rec(p,iNode_00);
          lVar12 = lVar12 + 1;
        } while (iNode < (p->vFanins).nSize);
      }
      goto LAB_004db2e0;
    }
  }
  return;
}

Assistant:

void Sfm_NtkDeleteObj_rec( Sfm_Ntk_t * p, int iNode )
{
    int i, iFanin;
    if ( Sfm_ObjFanoutNum(p, iNode) > 0 || Sfm_ObjIsPi(p, iNode) || Sfm_ObjIsFixed(p, iNode) )
        return;
    assert( Sfm_ObjIsNode(p, iNode) );
    Sfm_ObjForEachFanin( p, iNode, iFanin, i )
    {
        int RetValue = Vec_IntRemove( Sfm_ObjFoArray(p, iFanin), iNode );  assert( RetValue );
        Sfm_NtkDeleteObj_rec( p, iFanin );
    }
    Vec_IntClear( Sfm_ObjFiArray(p, iNode) );
    Vec_WrdWriteEntry( p->vTruths, iNode, (word)0 );
}